

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScArray(Lowerer *this,Instr *arrInstr)

{
  ProfileId index;
  code *pcVar1;
  bool bVar2;
  uint32 length;
  JitProfilingInstr *arrInstr_00;
  Instr *pIVar3;
  intptr_t weakFuncRef;
  undefined4 *puVar4;
  ProfiledInstr *pPVar5;
  JITTimeProfileInfo *pJVar6;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  IntConstOpnd *this_00;
  AddrOpnd *pAVar7;
  Opnd *opndArg;
  JnHelperMethod helperMethod;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (arrInstr->m_kind == InstrKindJitProfiling) {
    arrInstr_00 = IR::Instr::AsJitProfilingInstr(arrInstr);
    pIVar3 = LowerProfiledNewScArray(this,arrInstr_00);
    return pIVar3;
  }
  pIVar3 = arrInstr->m_prev;
  helperMethod = HelperScrArr_OP_NewScArray;
  if (arrInstr->m_kind == InstrKindProfiled) {
    bVar2 = Func::HasProfileInfo(arrInstr->m_func);
    if (!bVar2) goto LAB_00551460;
    weakFuncRef = Func::GetWeakFuncRef(arrInstr->m_func);
    if (weakFuncRef == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe34,"(weakFuncRef)","weakFuncRef");
      if (!bVar2) goto LAB_005514b1;
      *puVar4 = 0;
    }
    pPVar5 = IR::Instr::AsProfiledInstr(arrInstr);
    index = (pPVar5->u).field_3.fldInfoData.f1;
    pJVar6 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
    arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar6,index);
    pJVar6 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
    arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar6,index);
    bVar2 = IR::Opnd::IsConstOpnd(arrInstr->m_src1);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe3a,"(arrInstr->GetSrc1()->IsConstOpnd())",
                         "arrInstr->GetSrc1()->IsConstOpnd()");
      if (!bVar2) {
LAB_005514b1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    this_00 = IR::Opnd::AsIntConstOpnd(arrInstr->m_src1);
    length = IR::IntConstOpnd::AsUint32(this_00);
    GenerateProfiledNewScArrayFastPath(this,arrInstr,arrayInfo,arrayInfoAddr,weakFuncRef,length);
    if (arrInstr->m_dst != (Opnd *)0x0) {
      local_32 = (arrInstr->m_dst->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32.field_0);
      if (bVar2) {
        pAVar7 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar7->super_Opnd);
        pAVar7 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar7->super_Opnd);
        helperMethod = HelperScrArr_ProfiledNewScArray;
      }
    }
  }
LAB_00551460:
  LoadScriptContext(this,arrInstr);
  opndArg = IR::Instr::UnlinkSrc1(arrInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,opndArg);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,arrInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScArray(IR::Instr *arrInstr)
{
    if (arrInstr->IsJitProfilingInstr())
    {
        return LowerProfiledNewScArray(arrInstr->AsJitProfilingInstr());
    }

    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScArray;

    if (arrInstr->IsProfiledInstr() && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        Assert(weakFuncRef);

        Js::ProfileId profileId = static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);
        Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

        Assert(arrInstr->GetSrc1()->IsConstOpnd());
        GenerateProfiledNewScArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef, arrInstr->GetSrc1()->AsIntConstOpnd()->AsUint32());

        if (arrInstr->GetDst() && arrInstr->GetDst()->GetValueType().IsLikelyNativeArray())
        {
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *src1Opnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, src1Opnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}